

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall Js::FunctionProxy::UpdateFunctionBodyImpl(FunctionProxy *this,FunctionBody *body)

{
  code *pcVar1;
  bool bVar2;
  Attributes AVar3;
  FunctionInfo *this_00;
  FunctionProxy *pFVar4;
  undefined4 *puVar5;
  FunctionInfo *functionInfo;
  FunctionBody *body_local;
  FunctionProxy *this_local;
  
  this_00 = GetFunctionInfo(this);
  pFVar4 = FunctionInfo::GetFunctionProxy(this_00);
  if (pFVar4 != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x80b,"(functionInfo->GetFunctionProxy() == this)",
                                "functionInfo->GetFunctionProxy() == this");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar2 = IsFunctionBody(this);
  if ((bVar2) && (body != (FunctionBody *)this)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x80c,"(!this->IsFunctionBody() || body == this)",
                                "!this->IsFunctionBody() || body == this");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  FunctionInfo::SetFunctionProxy(this_00,(FunctionProxy *)body);
  SetFunctionInfo((FunctionProxy *)body,this_00);
  AVar3 = FunctionInfo::GetAttributes(this_00);
  SetAttributes((FunctionProxy *)body,AVar3 & ~(DeferredParse|DeferredDeserialize));
  return;
}

Assistant:

void
    FunctionProxy::UpdateFunctionBodyImpl(FunctionBody * body)
    {
        FunctionInfo *functionInfo = this->GetFunctionInfo();
        Assert(functionInfo->GetFunctionProxy() == this);
        Assert(!this->IsFunctionBody() || body == this);
        functionInfo->SetFunctionProxy(body);
        body->SetFunctionInfo(functionInfo);
        body->SetAttributes((FunctionInfo::Attributes)(functionInfo->GetAttributes() & ~(FunctionInfo::Attributes::DeferredParse | FunctionInfo::Attributes::DeferredDeserialize)));
    }